

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmAbc.c
# Opt level: O2

void Mig_ManCreateChoices(Mig_Man_t *pMig,Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  Gia_Obj_t *pObj;
  Mig_Obj_t *pMVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pObj_00;
  uint i;
  char *__assertion;
  ulong uVar5;
  
  if (pMig->nObjs == p->nObjs) {
    if ((pMig->vSibls).nSize == 0) {
      Vec_IntFill(&pMig->vSibls,pMig->nObjs,0);
      Gia_ManMarkFanoutDrivers(p);
      for (uVar5 = 0; (long)uVar5 < (long)p->nObjs; uVar5 = uVar5 + 1) {
        iVar2 = (int)uVar5;
        pObj = Gia_ManObj(p,iVar2);
        if (pObj == (Gia_Obj_t *)0x0) break;
        Gia_ObjSetPhase(p,pObj);
        uVar1 = Abc_Lit2Var(pObj->Value);
        if (uVar5 != uVar1) {
          __assertion = "Abc_Lit2Var(pObj->Value) == i";
          uVar1 = 0x39;
          goto LAB_006f4535;
        }
        pMVar3 = Mig_ManObj(pMig,iVar2);
        pMVar3->pFans[3] =
             (Mig_Fan_t)
             ((uint)pMVar3->pFans[3] & 0xfffffffe | (uint)((ulong)*(undefined8 *)pObj >> 0x3f));
        if (((p->pSibls != (int *)0x0) && (p->pSibls[uVar5] != 0)) &&
           ((pObj->field_0x3 & 0x40) != 0)) {
          pGVar4 = Gia_ObjSiblObj(p,iVar2);
          while (pObj_00 = pGVar4, pObj_00 != (Gia_Obj_t *)0x0) {
            iVar2 = Abc_Lit2Var(pObj->Value);
            pMVar3 = Mig_ManObj(pMig,iVar2);
            uVar1 = Abc_Lit2Var(pObj_00->Value);
            if ((uVar1 == 0) || (i = (uint)pMVar3->pFans[3] >> 1, i <= uVar1)) {
              __assert_fail("s > 0 && Mig_ObjId(p) > s",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMig.h"
                            ,0xbd,"void Mig_ObjSetSiblId(Mig_Obj_t *, int)");
            }
            Vec_IntWriteEntry((Vec_Int_t *)
                              (*(long *)((long)pMVar3 + (-0x10 - (ulong)((i & 0xfff) << 4))) + 0x78)
                              ,i,uVar1);
            iVar2 = Gia_ObjId(p,pObj_00);
            pGVar4 = Gia_ObjSiblObj(p,iVar2);
            pObj = pObj_00;
          }
          pMig->nChoices = pMig->nChoices + 1;
        }
      }
      Gia_ManCleanMark0(p);
      return;
    }
    __assertion = "Vec_IntSize(&pMig->vSibls) == 0";
    uVar1 = 0x33;
  }
  else {
    __assertion = "Mig_ManObjNum(pMig) == Gia_ManObjNum(p)";
    uVar1 = 0x32;
  }
LAB_006f4535:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmAbc.c"
                ,uVar1,"void Mig_ManCreateChoices(Mig_Man_t *, Gia_Man_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Mig_ManCreateChoices( Mig_Man_t * pMig, Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    assert( Mig_ManObjNum(pMig) == Gia_ManObjNum(p) );
    assert( Vec_IntSize(&pMig->vSibls) == 0 );
    Vec_IntFill( &pMig->vSibls, Gia_ManObjNum(p), 0 );
    Gia_ManMarkFanoutDrivers( p );
    Gia_ManForEachObj( p, pObj, i )
    {
        Gia_ObjSetPhase( p, pObj );
        assert( Abc_Lit2Var(pObj->Value) == i );
        Mig_ObjSetPhase( Mig_ManObj(pMig, i), pObj->fPhase );
        if ( Gia_ObjSibl(p, i) && pObj->fMark0 )
        {
            Gia_Obj_t * pSibl, * pPrev;
            for ( pPrev = pObj, pSibl = Gia_ObjSiblObj(p, i); pSibl; pPrev = pSibl, pSibl = Gia_ObjSiblObj(p, Gia_ObjId(p, pSibl)) )
                Mig_ObjSetSiblId( Mig_ManObj(pMig, Abc_Lit2Var(pPrev->Value)), Abc_Lit2Var(pSibl->Value) );
            pMig->nChoices++;
        }
    }
    Gia_ManCleanMark0( p );
}